

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::ClipperOffset::~ClipperOffset(ClipperOffset *this)

{
  pointer pDVar1;
  pointer pIVar2;
  
  Clear(this);
  PolyNode::~PolyNode(&this->m_polyNodes);
  pDVar1 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pDVar1 != (pointer)0x0) {
    operator_delete(pDVar1,(long)(this->m_normals).
                                 super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar1);
  }
  pIVar2 = (this->m_destPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pIVar2 != (pointer)0x0) {
    operator_delete(pIVar2,(long)(this->m_destPoly).
                                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar2);
  }
  pIVar2 = (this->m_srcPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pIVar2 != (pointer)0x0) {
    operator_delete(pIVar2,(long)(this->m_srcPoly).
                                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar2);
  }
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&this->m_destPolys);
  return;
}

Assistant:

ClipperOffset::~ClipperOffset()
{
  Clear();
}